

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O0

void prframe(FILE *file,timeval *tv,int dev,canfd_frame *cf,uint max_dlen,char *extra_info)

{
  int in_EDX;
  undefined8 *in_RSI;
  FILE *in_RDI;
  int in_stack_000000d8;
  int in_stack_000000dc;
  char *in_stack_000000e0;
  canfd_frame *in_stack_000000e8;
  FILE *in_stack_000000f0;
  
  fprintf(in_RDI,"(%lu.%06lu) ",*in_RSI,in_RSI[1]);
  if (in_EDX < 1) {
    fprintf(in_RDI,"canX ");
  }
  else {
    fprintf(in_RDI,"can%d ",(ulong)(in_EDX - 1));
  }
  fprint_canframe(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,
                  in_stack_000000d8);
  return;
}

Assistant:

void prframe(FILE *file, struct timeval *tv, int dev, struct canfd_frame *cf, unsigned int max_dlen, char *extra_info) {

	fprintf(file, "(%lu.%06lu) ", tv->tv_sec, tv->tv_usec);

	if (dev > 0)
		fprintf(file, "can%d ", dev-1);
	else
		fprintf(file, "canX ");

	fprint_canframe(file, cf, extra_info, 0, max_dlen);
}